

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O2

void mbedtls_asn1_free_named_data_list(mbedtls_asn1_named_data **head)

{
  mbedtls_asn1_named_data *__ptr;
  
  while (__ptr = *head, __ptr != (mbedtls_asn1_named_data *)0x0) {
    *head = __ptr->next;
    free((__ptr->oid).p);
    free((__ptr->val).p);
    free(__ptr);
  }
  return;
}

Assistant:

void mbedtls_asn1_free_named_data_list(mbedtls_asn1_named_data **head)
{
    mbedtls_asn1_named_data *cur;

    while ((cur = *head) != NULL) {
        *head = cur->next;
        mbedtls_free(cur->oid.p);
        mbedtls_free(cur->val.p);
        mbedtls_free(cur);
    }
}